

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Gia_ManSimplifyAnd(Vec_Int_t *vSuper)

{
  uint uVar1;
  int *__ptr;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = vSuper->nSize;
  if ((int)uVar4 < 1) {
    if ((int)uVar4 < 0) goto LAB_007d48e4;
    vSuper->nSize = 0;
  }
  else {
    __ptr = vSuper->pArray;
    lVar3 = 0;
    uVar6 = 0xffffffff;
    uVar2 = 0;
    do {
      uVar1 = __ptr[lVar3];
      if (uVar1 != 1) {
        if (uVar1 == 0) {
LAB_007d4876:
          if (vSuper->nCap < 1) {
            __ptr = (int *)realloc(__ptr,4);
            vSuper->pArray = __ptr;
            if (__ptr == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vSuper->nCap = 1;
          }
          *__ptr = 0;
          vSuper->nSize = 1;
          return;
        }
        if (uVar6 != 0xffffffff) {
          if (((int)uVar6 < 0) || ((int)uVar1 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if ((uVar1 ^ uVar6) < 2) {
            if (uVar6 != uVar1) goto LAB_007d4876;
            goto LAB_007d483f;
          }
        }
        if (((int)uVar2 < 0) || (uVar4 <= uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
        __ptr[uVar5] = uVar1;
        uVar4 = vSuper->nSize;
        uVar6 = uVar1;
      }
LAB_007d483f:
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)uVar4);
    if ((int)uVar4 < (int)uVar2) {
LAB_007d48e4:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vSuper->nSize = uVar2;
    if (uVar2 != 0) {
      return;
    }
  }
  Vec_IntPush(vSuper,1);
  return;
}

Assistant:

static inline void Gia_ManSimplifyAnd( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            { Vec_IntFill(vSuper, 1, 0); return; }
        if ( This == 1 )
            continue;
        if ( Prev == -1 || Abc_Lit2Var(Prev) != Abc_Lit2Var(This) )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else if ( Prev != This )
            { Vec_IntFill(vSuper, 1, 0); return; }
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, 1 );
}